

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O2

void __thiscall LatencyItem::LatencyItem(LatencyItem *this,LatencyItem *src)

{
  std::__cxx11::string::string((string *)this,(string *)src);
  Histogram::Histogram(&this->hist,&src->hist);
  return;
}

Assistant:

LatencyItem(const LatencyItem& src)
        : statName(src.statName)
        , hist(src.hist) {}